

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall CTxMemPool::ApplyDelta(CTxMemPool *this,uint256 *hash,CAmount *nFeeDelta)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  long *in_RDX;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *in_RDI;
  long in_FS_OFFSET;
  CAmount *delta;
  const_iterator pos;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  _Self *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffc8,(char *)in_RDI,in_stack_ffffffffffffffbc,
             (AnnotatedMixin<std::recursive_mutex> *)0x763a7b);
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
  find(in_RDI,(key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::end
            (in_RDI);
  bVar2 = std::operator==(in_stack_ffffffffffffffc8,(_Self *)in_RDI);
  if (!bVar2) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_long>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_uint256,_long>_> *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *in_RDX = ppVar3->second + *in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::ApplyDelta(const uint256& hash, CAmount &nFeeDelta) const
{
    AssertLockHeld(cs);
    std::map<uint256, CAmount>::const_iterator pos = mapDeltas.find(hash);
    if (pos == mapDeltas.end())
        return;
    const CAmount &delta = pos->second;
    nFeeDelta += delta;
}